

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

HelicsTranslator
helicsFederateRegisterGlobalTranslator
          (HelicsFederate fed,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *puVar2;
  ulong uVar3;
  Federate *pFVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TranslatorObject *pTVar6;
  size_t sVar7;
  Filter *pFVar8;
  ulong uVar9;
  const_iterator __position;
  _Alloc_hider _Var10;
  FedObject *fedObj;
  string_view translatorName;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> local_68;
  TranslatorObject *local_60;
  Federate *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  getFedSharedPtr(&local_58,(HelicsError *)fed);
  pFVar4 = local_58;
  if (local_58 == (Federate *)0x0) {
    pTVar6 = (TranslatorObject *)0x0;
  }
  else {
    pTVar6 = (TranslatorObject *)operator_new(0x38);
    (pTVar6->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pTVar6->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar6->mTrans)._M_t.
    super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
    super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
    super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl = (Translator *)0x0;
    (pTVar6->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    pTVar6->custom = false;
    *(undefined3 *)&pTVar6->field_0x1 = 0;
    pTVar6->valid = 0;
    pTVar6->transPtr = (Translator *)0x0;
    (pTVar6->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar7 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var10 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    local_60 = pTVar6;
    if (name != (char *)0x0) {
      sVar7 = strlen(name);
      _Var10._M_p = name;
    }
    local_48 = 0;
    uStack_40 = 0;
    translatorName._M_str = _Var10._M_p;
    translatorName._M_len = sVar7;
    pFVar8 = helics::Federate::registerGlobalTranslator
                       (pFVar4,type,translatorName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    p_Var5 = p_Stack_50;
    pFVar4 = local_58;
    pTVar6->transPtr = (Translator *)pFVar8;
    local_58 = (Federate *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pTVar6->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pTVar6->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pFVar4;
    (pTVar6->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      pTVar6 = local_60;
    }
    pTVar6->custom = type == HELICS_TRANSLATOR_TYPE_CUSTOM;
    local_60 = (TranslatorObject *)0x0;
    pTVar6->valid = -0x4c83cad2;
    __position._M_current =
         *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> **)
          ((long)fed + 0xb0);
    puVar2 = *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
               **)((long)fed + 0xb8);
    local_68._M_head_impl = pTVar6;
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pTVar6->transPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
         .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
      ::
      emplace_back<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>
                ((vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
                  *)((long)fed + 0xb0),
                 (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                  *)&local_68);
    }
    else {
      uVar9 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar9, 0 < (long)uVar3) {
        uVar9 = uVar3 >> 1;
        if (((__position._M_current[uVar9]._M_t.
              super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
              .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar9 + 1;
          uVar9 = ~uVar9 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                        *)((long)fed + 0xb0),__position,(value_type *)&local_68);
    }
    if (local_68._M_head_impl != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_68,local_68._M_head_impl);
    }
    local_68._M_head_impl = (TranslatorObject *)0x0;
    if (local_60 != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_60,local_60);
    }
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return pTVar6;
}

Assistant:

HelicsTranslator helicsFederateRegisterGlobalTranslator(HelicsFederate fed, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto trans = std::make_unique<helics::TranslatorObject>();
        trans->transPtr = &fedObj->registerGlobalTranslator(type, AS_STRING_VIEW(name));
        trans->fedptr = std::move(fedObj);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return federateAddTranslator(fed, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}